

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::BaseAppender::AppendValueInternal<duckdb::uhugeint_t,unsigned_long>
          (BaseAppender *this,Vector *col,uhugeint_t input)

{
  bool bVar1;
  InvalidInputException *this_00;
  uint64_t uVar2;
  bool in_R8B;
  uhugeint_t input_00;
  uhugeint_t input_01;
  unsigned_long result;
  undefined8 local_50;
  string local_48;
  
  uVar2 = 0;
  input_01.upper = (uint64_t)&local_50;
  input_01.lower = input.upper;
  bVar1 = TryCast::Operation<duckdb::uhugeint_t,unsigned_long>
                    ((TryCast *)input.lower,input_01,(uint64_t *)0x0,in_R8B);
  if (bVar1) {
    *(undefined8 *)(col->data + (this->chunk).count * 8) = local_50;
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  input_00.upper = uVar2;
  input_00.lower = input.upper;
  CastExceptionText<duckdb::uhugeint_t,unsigned_long>(&local_48,(duckdb *)input.lower,input_00);
  InvalidInputException::InvalidInputException(this_00,&local_48);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}